

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O2

void P_AutoUseStrifeHealth(player_t *player)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  AInventory *local_40;
  TArray<AInventory_*,_AInventory_*> Items;
  
  Items.Array = (AInventory **)0x0;
  Items.Most = 0;
  Items.Count = 0;
  local_40 = GC::ReadBarrier<AInventory>((AInventory **)&(player->mo->super_AActor).Inventory);
  for (; local_40 != (AInventory *)0x0;
      local_40 = GC::ReadBarrier<AInventory>((AInventory **)&(local_40->super_AActor).Inventory)) {
    if (0 < local_40->Amount) {
      bVar1 = DObject::IsKindOf((DObject *)local_40,AHealthPickup::RegistrationInfo.MyClass);
      if ((bVar1) && (*(int *)&local_40->field_0x4fc == 3)) {
        TArray<AInventory_*,_AInventory_*>::Push(&Items,&local_40);
      }
    }
  }
  local_40 = (AInventory *)0x0;
  if (sv_disableautohealth.Value == false) {
    while ((ulong)Items._8_8_ >> 0x20 != 0) {
      iVar2 = 0;
      uVar4 = 0xffffffff;
      for (uVar3 = 0; (ulong)Items._8_8_ >> 0x20 != uVar3; uVar3 = uVar3 + 1) {
        if (iVar2 < (Items.Array[uVar3]->super_AActor).health) {
          iVar2 = Items.Array[uVar3]->Amount;
          uVar4 = uVar3 & 0xffffffff;
        }
      }
      do {
        if (0x31 < player->health) goto LAB_004082d5;
        iVar2 = (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x17])
                          (player->mo,Items.Array[(int)(uint)uVar4]);
      } while ((char)iVar2 != '\0');
      if (0x31 < player->health) break;
      TArray<AInventory_*,_AInventory_*>::Delete(&Items,(uint)uVar4);
    }
  }
LAB_004082d5:
  TArray<AInventory_*,_AInventory_*>::~TArray(&Items);
  return;
}

Assistant:

void P_AutoUseStrifeHealth (player_t *player)
{
	TArray<AInventory *> Items;

	for(AInventory *inv = player->mo->Inventory; inv != NULL; inv = inv->Inventory)
	{
		if (inv->Amount > 0 && inv->IsKindOf(RUNTIME_CLASS(AHealthPickup)))
		{
			int mode = static_cast<AHealthPickup*>(inv)->autousemode;

			if (mode == 3) Items.Push(inv);
		}
	}

	if (!sv_disableautohealth)
	{
		while (Items.Size() > 0)
		{
			int maxhealth = 0;
			int index = -1;

			// Find the largest item in the list
			for(unsigned i = 0; i < Items.Size(); i++)
			{
				if (Items[i]->health > maxhealth)
				{
					index = i;
					maxhealth = Items[i]->Amount;
				}
			}

			while (player->health < 50)
			{
				if (!player->mo->UseInventory (Items[index]))
					break;
			}
			if (player->health >= 50) return;
			// Using all of this item was not enough so delete it and restart with the next best one
			Items.Delete(index);
		}
	}
}